

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O1

bool MoveCeiling(sector_t_conflict *sector,int crush,double move)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  
  (sector->ceilingplane).D = (sector->ceilingplane).D - (sector->ceilingplane).normal.Z * move;
  sector->planes[1].TexZ = sector->planes[1].TexZ + move;
  bVar3 = P_ChangeSector(sector,crush,move,1,true);
  if ((bVar3) ||
     ((((((dVar2 = (sector->ceilingplane).normal.X, dVar2 == 0.0 && (!NAN(dVar2))) &&
         (dVar2 = (sector->ceilingplane).normal.Y, dVar2 == 0.0)) &&
        ((!NAN(dVar2) && (dVar2 = (sector->floorplane).normal.X, dVar2 == 0.0)))) &&
       ((!NAN(dVar2) && ((dVar2 = (sector->floorplane).normal.Y, dVar2 == 0.0 && (!NAN(dVar2)))))))
      && ((sectorPortals.Array[sector->Portals[0]].mType != 3 &&
          (dVar2 = sector->planes[0].TexZ, pdVar1 = &sector->planes[1].TexZ,
          *pdVar1 <= dVar2 && dVar2 != *pdVar1)))))) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

static bool MoveCeiling(sector_t *sector, int crush, double move)
{
	sector->ceilingplane.ChangeHeight (move);
	sector->ChangePlaneTexZ(sector_t::ceiling, move);

	if (P_ChangeSector(sector, crush, move, 1, true)) return false;

	// Don't let the ceiling go below the floor
	if (!sector->ceilingplane.isSlope() && !sector->floorplane.isSlope() &&
		!sector->PortalIsLinked(sector_t::floor) &&
		sector->GetPlaneTexZ(sector_t::floor)  > sector->GetPlaneTexZ(sector_t::ceiling)) return false;

	return true;
}